

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_executor.cpp
# Opt level: O2

void __thiscall duckdb::TaskExecutor::WorkOnTasks(TaskExecutor *this)

{
  TaskScheduler *this_00;
  bool bVar1;
  type token;
  Task *pTVar2;
  shared_ptr<duckdb::Task,_true> task_from_producer;
  __shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_38._M_ptr = (element_type *)0x0;
  local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    this_00 = this->scheduler;
    token = unique_ptr<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>,_true>::
            operator*(&this->token);
    bVar1 = TaskScheduler::GetTaskFromProducer
                      (this_00,token,(shared_ptr<duckdb::Task,_true> *)&local_38);
    if (!bVar1) break;
    pTVar2 = shared_ptr<duckdb::Task,_true>::operator->((shared_ptr<duckdb::Task,_true> *)&local_38)
    ;
    (*pTVar2->_vptr_Task[2])(pTVar2,0);
    ::std::__shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>::reset(&local_38);
  }
  do {
  } while ((this->completed_tasks).super___atomic_base<unsigned_long>._M_i !=
           (this->total_tasks).super___atomic_base<unsigned_long>._M_i);
  if (((this->error_manager).has_error._M_base._M_i & 1U) != 0) {
    TaskErrorManager::ThrowException(&this->error_manager);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return;
}

Assistant:

void TaskExecutor::WorkOnTasks() {
	// repeatedly execute tasks until we are finished
	shared_ptr<Task> task_from_producer;
	while (scheduler.GetTaskFromProducer(*token, task_from_producer)) {
		auto res = task_from_producer->Execute(TaskExecutionMode::PROCESS_ALL);
		(void)res;
		D_ASSERT(res != TaskExecutionResult::TASK_BLOCKED);
		task_from_producer.reset();
	}
	// wait for all active tasks to finish
	while (completed_tasks != total_tasks) {
	}

	// check if we ran into any errors while checkpointing
	if (HasError()) {
		// throw the error
		ThrowError();
	}
}